

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O1

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Vec4 *reference,
               ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  ostringstream *poVar1;
  float fVar2;
  int width;
  TextureFormat TVar3;
  ulong uVar4;
  int i;
  TextureChannelClass TVar5;
  long lVar6;
  ulong uVar7;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int y;
  int z;
  int iVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  Vector<float,_4> res;
  Vec4 pixelScale;
  Vec4 diff;
  Vec4 cmpPix;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  allocator<char> local_3ee;
  allocator<char> local_3ed;
  int local_3ec;
  TextureFormat local_3e8;
  int local_3dc;
  LogImageSet local_3d8;
  string local_398;
  string local_378;
  Vec4 local_358;
  char *local_348;
  char *local_340;
  string local_338;
  undefined1 *local_318;
  undefined1 *puStack_310;
  Vector<float,_4> local_308;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  LogImage local_298;
  undefined1 local_200 [32];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_188 [264];
  ConstPixelBufferAccess local_80;
  TextureLevel local_58;
  
  width = (result->m_size).m_data[0];
  local_3ec = (result->m_size).m_data[1];
  iVar8 = (result->m_size).m_data[2];
  local_200._0_4_ = RGB;
  local_200._4_4_ = UNORM_INT8;
  local_3e8 = (TextureFormat)log;
  local_348 = imageSetDesc;
  local_340 = imageSetName;
  TextureLevel::TextureLevel(&local_58,(TextureFormat *)local_200,width,local_3ec,iVar8);
  TextureLevel::getAccess((PixelBufferAccess *)&local_80,&local_58);
  local_308.m_data._0_8_ = (pointer)0x0;
  local_308.m_data[2] = 0.0;
  local_308.m_data[3] = 0.0;
  local_358.m_data[0] = 0.0;
  local_358.m_data[1] = 0.0;
  local_358.m_data[2] = 0.0;
  local_358.m_data[3] = 0.0;
  local_318 = &DAT_3f8000003f800000;
  puStack_310 = &DAT_3f8000003f800000;
  if (0 < iVar8) {
    z = 0;
    local_3dc = iVar8;
    do {
      if (0 < local_3ec) {
        iVar8 = 0;
        do {
          if (0 < width) {
            y = 0;
            do {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_200,(int)result,y,iVar8);
              local_3d8.m_name._M_dataplus._M_p = (pointer)0x0;
              local_3d8.m_name._M_string_length = 0;
              lVar6 = 0;
              do {
                *(float *)((long)&local_3d8.m_name._M_dataplus._M_p + lVar6 * 4) =
                     reference->m_data[lVar6] - *(float *)(local_200 + lVar6 * 4);
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              local_298.m_name._M_dataplus._M_p = (char *)0x0;
              local_298.m_name._M_string_length = 0;
              lVar6 = 0;
              do {
                fVar2 = *(float *)((long)&local_3d8.m_name._M_dataplus._M_p + lVar6 * 4);
                fVar11 = -fVar2;
                if (-fVar2 <= fVar2) {
                  fVar11 = fVar2;
                }
                *(float *)((long)(&local_298.m_access.m_size + -6) + lVar6 * 4) = fVar11;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              local_3d8.m_name._M_dataplus._M_p =
                   local_3d8.m_name._M_dataplus._M_p & 0xffffffff00000000;
              lVar6 = 0;
              do {
                *(bool *)((long)&local_3d8.m_name._M_dataplus._M_p + lVar6) =
                     *(float *)((long)(&local_298.m_access.m_size + -6) + lVar6 * 4) <=
                     threshold->m_data[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              if ((char)local_3d8.m_name._M_dataplus._M_p == '\0') {
                bVar9 = false;
              }
              else {
                uVar4 = 0;
                do {
                  uVar7 = uVar4;
                  if (uVar7 == 3) break;
                  uVar4 = uVar7 + 1;
                } while (*(char *)((long)&local_3d8.m_name._M_dataplus._M_p + uVar7 + 1) != '\0');
                bVar9 = 2 < uVar7;
              }
              local_3d8.m_name._M_dataplus._M_p = (pointer)0x0;
              local_3d8.m_name._M_string_length = 0;
              lVar6 = 0;
              do {
                fVar2 = *(float *)((long)(&local_298.m_access.m_size + -6) + lVar6 * 4);
                uVar10 = -(uint)(fVar2 <= local_308.m_data[lVar6]);
                *(uint *)((long)&local_3d8.m_name._M_dataplus._M_p + lVar6 * 4) =
                     ~uVar10 & (uint)fVar2 | (uint)local_308.m_data[lVar6] & uVar10;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              local_308.m_data._0_8_ = local_3d8.m_name._M_dataplus._M_p;
              local_308.m_data[2] = (float)(undefined4)local_3d8.m_name._M_string_length;
              local_308.m_data[3] = (float)local_3d8.m_name._M_string_length._4_4_;
              if (bVar9) {
                local_3d8.m_name._M_dataplus._M_p = (char *)0x3f80000000000000;
              }
              else {
                local_3d8.m_name._M_dataplus._M_p = (char *)0x3f800000;
              }
              local_3d8.m_name._M_string_length = 0x3f80000000000000;
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_80,(Vec4 *)&local_3d8,y,iVar8,z);
              y = y + 1;
            } while (y != width);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != local_3ec);
      }
      z = z + 1;
    } while (z != local_3dc);
  }
  local_200._0_8_ = local_200._0_8_ & 0xffffffff00000000;
  lVar6 = 0;
  do {
    local_200[lVar6] = local_308.m_data[lVar6] <= threshold->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (local_200[0] == R) {
    bVar9 = false;
  }
  else {
    uVar4 = 0;
    do {
      uVar7 = uVar4;
      if (uVar7 == 3) break;
      uVar4 = uVar7 + 1;
    } while (local_200[uVar7 + 1] != '\0');
    bVar9 = 2 < uVar7;
  }
  if ((logMode != COMPARE_LOG_EVERYTHING & bVar9) == 0) {
    TVar5 = getTextureChannelClass((result->m_format).type);
    if (TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      anon_unknown_50::computeScaleAndBias(result,result,(Vec4 *)&local_318,&local_358);
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_4_ = local_3e8.order;
      local_200._4_4_ = local_3e8.type;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Result image is normalized with formula p * ",0x2c);
      operator<<((ostream *)poVar1,(Vector<float,_4> *)&local_318);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," + ",3);
      operator<<((ostream *)poVar1,&local_358);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
    }
    if (bVar9 == false) {
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_4_ = local_3e8.order;
      local_200._4_4_ = local_3e8.type;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image comparison failed: max difference = ",0x2a);
      operator<<((ostream *)poVar1,&local_308);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", threshold = ",0xe);
      operator<<((ostream *)poVar1,threshold);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", reference = ",0xe);
      operator<<((ostream *)poVar1,reference);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,local_340,&local_3ed);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,local_348,&local_3ee);
    TVar3 = local_3e8;
    LogImageSet::LogImageSet(&local_3d8,&local_338,&local_378);
    TestLog::startImageSet
              ((TestLog *)TVar3,local_3d8.m_name._M_dataplus._M_p,
               local_3d8.m_description._M_dataplus._M_p);
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"Result","");
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_398,&local_2d8,result,(Vec4 *)&local_318,
                       &local_358,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,TVar3.order,__buf_00,(size_t)result);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"ErrorMask","");
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Error mask","");
    access = &local_80;
    LogImage::LogImage(&local_298,&local_2f8,&local_2b8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_298,TVar3.order,__buf_01,(size_t)access);
    TestLog::endImageSet((TestLog *)TVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
      operator_delete(local_298.m_description._M_dataplus._M_p,
                      local_298.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
      operator_delete(local_298.m_name._M_dataplus._M_p,
                      local_298.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200._0_8_ != (long)local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_description._M_dataplus._M_p != &local_3d8.m_description.field_2) {
      operator_delete(local_3d8.m_description._M_dataplus._M_p,
                      local_3d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_name._M_dataplus._M_p != &local_3d8.m_name.field_2) {
      operator_delete(local_3d8.m_name._M_dataplus._M_p,
                      local_3d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p == &local_338.field_2) goto LAB_005df03f;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_005df03f;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,(Vec4 *)&local_318,&local_358);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,local_340,(allocator<char> *)&local_2d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_348,(allocator<char> *)&local_2f8);
    TVar3 = local_3e8;
    LogImageSet::LogImageSet((LogImageSet *)&local_298,&local_3d8.m_name,&local_338);
    TestLog::startImageSet
              ((TestLog *)TVar3,local_298.m_name._M_dataplus._M_p,
               local_298.m_description._M_dataplus._M_p);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Result","");
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_378,&local_398,result,(Vec4 *)&local_318,
                       &local_358,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,TVar3.order,__buf,(size_t)result);
    TestLog::endImageSet((TestLog *)TVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200._0_8_ != (long)local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
      operator_delete(local_298.m_description._M_dataplus._M_p,
                      local_298.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
      operator_delete(local_298.m_name._M_dataplus._M_p,
                      local_298.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    local_338.field_2._M_allocated_capacity = local_3d8.m_name.field_2._M_allocated_capacity;
    local_338._M_dataplus._M_p = local_3d8.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_name._M_dataplus._M_p == &local_3d8.m_name.field_2) goto LAB_005df03f;
  }
  operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
LAB_005df03f:
  TextureLevel::~TextureLevel(&local_58);
  return bVar9;
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Vec4& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	const int			width				= result.getWidth();
	const int			height				= result.getHeight();
	const int			depth				= result.getDepth();

	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	cmpPix		= result.getPixel(x, y, z);
				const Vec4	diff		= abs(reference - cmpPix);
				const bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(result.getFormat().type) != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(result, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result image is normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << ", reference = " << reference << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}